

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset_s.c
# Opt level: O2

errno_t memset_s(void *s,rsize_t smax,int c,rsize_t n)

{
  rsize_t rVar1;
  errno_t eVar2;
  
  if (((smax < n) || (s == (void *)0x0)) || ((long)(n | smax) < 0)) {
    if (-1 < (long)smax && s != (void *)0x0) {
      memset(s,c,smax);
    }
    eVar2 = 0x16;
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  }
  else {
    eVar2 = 0;
    for (rVar1 = 0; n != rVar1; rVar1 = rVar1 + 1) {
      *(char *)((long)s + rVar1) = (char)c;
    }
  }
  return eVar2;
}

Assistant:

errno_t memset_s( void * s, rsize_t smax, int c, rsize_t n )
{
    unsigned char * p = ( unsigned char * ) s;

    if ( s == NULL || smax > RSIZE_MAX || n > RSIZE_MAX || n > smax )
    {
        if ( s != NULL && smax <= RSIZE_MAX )
        {
            memset( s, c, smax );
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    while ( n-- )
    {
        *p++ = ( unsigned char ) c;
    }

    return 0;
}